

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

EbmlElement * __thiscall
libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt,bool bCreateIfNull)

{
  pointer ppEVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppEVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  EbmlElement *local_38;
  EbmlElement *pEVar6;
  
  ppEVar7 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar1 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)ppEVar1 - (long)ppEVar7 >> 3;
  if (ppEVar1 != ppEVar7) {
    uVar5 = uVar8 + (uVar8 == 0);
    uVar9 = 1;
    do {
      if (ppEVar7[uVar9 - 1] == PastElt) goto LAB_001852e9;
      bVar10 = uVar9 != uVar5;
      uVar9 = uVar9 + 1;
    } while (bVar10);
LAB_001852f7:
    if (uVar5 == uVar8) {
      if (bCreateIfNull) {
        iVar4 = (*PastElt->_vptr_EbmlElement[5])(PastElt);
        pEVar6 = (EbmlElement *)CONCAT44(extraout_var_01,iVar4);
        local_38 = pEVar6;
        std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
        emplace_back<libebml::EbmlElement*>
                  ((vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
                   &this->ElementList,&local_38);
      }
      else {
        pEVar6 = (EbmlElement *)0x0;
      }
    }
    else {
      pEVar6 = ppEVar7[uVar5];
    }
    return pEVar6;
  }
  uVar9 = 0;
LAB_001852e9:
  do {
    uVar5 = uVar9;
    if (uVar8 <= uVar5) goto LAB_001852f7;
    iVar3 = (*PastElt->_vptr_EbmlElement[3])(PastElt);
    iVar4 = *(int *)CONCAT44(extraout_var,iVar3);
    lVar2 = *(long *)((int *)CONCAT44(extraout_var,iVar3) + 2);
    iVar3 = (*(this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_EbmlElement[3])();
    ppEVar7 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((*(long *)((int *)CONCAT44(extraout_var_00,iVar3) + 2) == lVar2) &&
       (*(int *)CONCAT44(extraout_var_00,iVar3) == iVar4)) {
      uVar8 = (long)ppEVar1 - (long)ppEVar7 >> 3;
      goto LAB_001852f7;
    }
    uVar8 = (long)ppEVar1 - (long)ppEVar7 >> 3;
    uVar9 = uVar5 + 1;
  } while( true );
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      break;
    Index++;
  }

  if (Index != ElementList.size())
    return ElementList[Index];

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &(PastElt.CreateElement());
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}